

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_descriptor_wsh(miniscript_node_t *node,miniscript_node_t *parent)

{
  miniscript_node_t *pmVar1;
  miniscript_node_t *pmVar2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  
  if (parent != (miniscript_node_t *)0x0) {
    if (parent->info == (miniscript_item_t *)0x0) {
      return -2;
    }
    if (parent->info->kind != 0x502) {
      return -2;
    }
  }
  iVar4 = 0;
  pmVar1 = node->child;
  for (pmVar2 = pmVar1; pmVar2 != (miniscript_node_t *)0x0; pmVar2 = pmVar2->next) {
    iVar4 = iVar4 + 1;
  }
  iVar5 = -2;
  if (((iVar4 == node->info->inner_num) && (pmVar1->info != (miniscript_item_t *)0x0)) &&
     (_Var3 = has_uncompressed_key_by_child(node), !_Var3)) {
    node->type_properties = pmVar1->type_properties;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int verify_descriptor_wsh(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    if (parent && (!parent->info || (parent->info->kind != DESCRIPTOR_KIND_DESCRIPTOR_SH)))
        return WALLY_EINVAL;
    if ((get_child_list_count(node) != node->info->inner_num) || !node->child->info)
        return WALLY_EINVAL;
    if (has_uncompressed_key_by_child(node))
        return WALLY_EINVAL;

    node->type_properties = node->child->type_properties;
    return WALLY_OK;
}